

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmDefinePropertyCommand::InitialPass
          (cmDefinePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  cmState *this_00;
  ostream *poVar4;
  ScopeType scope;
  ulong uVar5;
  int iVar6;
  string local_1d8;
  string *local_1b8;
  string *local_1b0;
  ostringstream e;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == __lhs) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&local_1d8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  else {
    bVar2 = std::operator==(__lhs,"GLOBAL");
    scope = GLOBAL;
    if (!bVar2) {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,"DIRECTORY");
      scope = DIRECTORY;
      if (!bVar2) {
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,"TARGET");
        scope = TARGET;
        if (!bVar2) {
          bVar2 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,"SOURCE");
          scope = SOURCE_FILE;
          if (!bVar2) {
            bVar2 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,"TEST");
            if (bVar2) {
              scope = TEST;
            }
            else {
              bVar2 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start,"VARIABLE");
              if (bVar2) {
                scope = VARIABLE;
              }
              else {
                bVar2 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start,"CACHED_VARIABLE"
                                       );
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                  poVar4 = std::operator<<((ostream *)&e,"given invalid scope ");
                  poVar4 = std::operator<<(poVar4,(string *)
                                                  (args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start);
                  poVar4 = std::operator<<(poVar4,".  ");
                  poVar4 = std::operator<<(poVar4,"Valid scopes are ");
                  poVar4 = std::operator<<(poVar4,"GLOBAL, DIRECTORY, TARGET, SOURCE, ");
                  std::operator<<(poVar4,"TEST, VARIABLE, CACHED_VARIABLE.");
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1d8);
LAB_002f9a9e:
                  std::__cxx11::string::~string((string *)&local_1d8);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                  return false;
                }
                scope = CACHED_VARIABLE;
              }
            }
          }
        }
      }
    }
    local_1b0 = (string *)&this->FullDocs;
    local_1b8 = (string *)&this->BriefDocs;
    bVar2 = false;
    iVar6 = 0;
    for (uVar5 = 1;
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar5 = (ulong)((int)uVar5 + 1)) {
      bVar3 = std::operator==(pbVar1 + uVar5,"PROPERTY");
      if (bVar3) {
        iVar6 = 1;
      }
      else {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar5,"BRIEF_DOCS");
        if (bVar3) {
LAB_002f985b:
          iVar6 = 2;
        }
        else {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar5,"FULL_DOCS");
          if (bVar3) {
LAB_002f9875:
            iVar6 = 3;
          }
          else {
            bVar3 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar5,"INHERITED");
            if (bVar3) {
              bVar2 = true;
              iVar6 = 0;
            }
            else {
              if (iVar6 == 3) {
                std::__cxx11::string::append(local_1b0);
                goto LAB_002f9875;
              }
              if (iVar6 == 2) {
                std::__cxx11::string::append(local_1b8);
                goto LAB_002f985b;
              }
              if (iVar6 != 1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                poVar4 = std::operator<<((ostream *)&e,"given invalid argument \"");
                poVar4 = std::operator<<(poVar4,(string *)
                                                ((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + uVar5)
                                        );
                std::operator<<(poVar4,"\".");
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1d8);
                goto LAB_002f9a9e;
              }
              std::__cxx11::string::_M_assign((string *)&this->PropertyName);
              iVar6 = 0;
            }
          }
        }
      }
    }
    if ((this->PropertyName)._M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)&e,"not given a PROPERTY <name> argument.",(allocator *)&local_1d8);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    }
    else if ((this->BriefDocs)._M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)&e,"not given a BRIEF_DOCS <brief-doc> argument.",(allocator *)&local_1d8
                );
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    }
    else {
      if ((this->FullDocs)._M_string_length != 0) {
        this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        cmState::DefineProperty
                  (this_00,&this->PropertyName,scope,(this->BriefDocs)._M_dataplus._M_p,
                   (this->FullDocs)._M_dataplus._M_p,bVar2);
        return true;
      }
      std::__cxx11::string::string
                ((string *)&e,"not given a FULL_DOCS <full-doc> argument.",(allocator *)&local_1d8);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    }
  }
  std::__cxx11::string::~string((string *)&e);
  return false;
}

Assistant:

bool cmDefinePropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Get the scope in which to define the property.
  cmProperty::ScopeType scope;
  if(args[0] == "GLOBAL")
    {
    scope = cmProperty::GLOBAL;
    }
  else if(args[0] == "DIRECTORY")
    {
    scope = cmProperty::DIRECTORY;
    }
  else if(args[0] == "TARGET")
    {
    scope = cmProperty::TARGET;
    }
  else if(args[0] == "SOURCE")
    {
    scope = cmProperty::SOURCE_FILE;
    }
  else if(args[0] == "TEST")
    {
    scope = cmProperty::TEST;
    }
  else if(args[0] == "VARIABLE")
    {
    scope = cmProperty::VARIABLE;
    }
  else if (args[0] == "CACHED_VARIABLE")
    {
    scope = cmProperty::CACHED_VARIABLE;
    }
  else
    {
    std::ostringstream e;
    e << "given invalid scope " << args[0] << ".  "
      << "Valid scopes are "
      << "GLOBAL, DIRECTORY, TARGET, SOURCE, "
      << "TEST, VARIABLE, CACHED_VARIABLE.";
    this->SetError(e.str());
    return false;
    }

  // Parse remaining arguments.
  bool inherited = false;
  enum Doing { DoingNone, DoingProperty, DoingBrief, DoingFull };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "PROPERTY")
      {
      doing = DoingProperty;
      }
    else if(args[i] == "BRIEF_DOCS")
      {
      doing = DoingBrief;
      }
    else if(args[i] == "FULL_DOCS")
      {
      doing = DoingFull;
      }
    else if(args[i] == "INHERITED")
      {
      doing = DoingNone;
      inherited = true;
      }
    else if(doing == DoingProperty)
      {
      doing = DoingNone;
      this->PropertyName = args[i];
      }
    else if(doing == DoingBrief)
      {
      this->BriefDocs += args[i];
      }
    else if(doing == DoingFull)
      {
      this->FullDocs += args[i];
      }
    else
      {
      std::ostringstream e;
      e << "given invalid argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Make sure a property name was found.
  if(this->PropertyName.empty())
    {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
    }

  // Make sure documentation was given.
  if(this->BriefDocs.empty())
    {
    this->SetError("not given a BRIEF_DOCS <brief-doc> argument.");
    return false;
    }
  if(this->FullDocs.empty())
    {
    this->SetError("not given a FULL_DOCS <full-doc> argument.");
    return false;
    }

  // Actually define the property.
  this->Makefile->GetState()->DefineProperty
    (this->PropertyName, scope,
     this->BriefDocs.c_str(), this->FullDocs.c_str(), inherited);

  return true;
}